

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrPassthroughColorMapMonoToMonoFB *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XrPassthroughColorMapMonoToMonoFB *pXVar2;
  byte bVar3;
  XrStructureType XVar4;
  pointer pcVar5;
  PFN_xrStructureTypeToString p_Var6;
  void *value_00;
  XrStructureType __val;
  uint uVar7;
  bool bVar8;
  char *pcVar9;
  XrInstance pXVar10;
  size_t sVar11;
  invalid_argument *this;
  uint uVar12;
  long lVar13;
  char cVar14;
  ulong uVar15;
  uint __len;
  uint8_t *__s;
  string type_prefix;
  string texturecolormap_prefix;
  string next_prefix;
  string texturecolormap_array_prefix;
  ostringstream oss_textureColorMap_array;
  ostringstream oss_textureColorMap;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  XrPassthroughColorMapMonoToMonoFB *local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  long *local_3a8;
  long local_3a0;
  long local_398 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  ios_base local_2b8 [272];
  undefined1 local_1a8 [24];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  paVar1 = &local_328.field_2;
  local_3d0 = value;
  local_328._M_dataplus._M_p = (pointer)paVar1;
  local_1a8._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_328,'\x12');
  *local_328._M_dataplus._M_p = '0';
  local_328._M_dataplus._M_p[1] = 'x';
  pcVar9 = local_328._M_dataplus._M_p + (local_328._M_string_length - 1);
  lVar13 = 0;
  do {
    bVar3 = local_1a8[lVar13];
    *pcVar9 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 & 0xf];
    pcVar9[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 >> 4];
    lVar13 = lVar13 + 1;
    pcVar9 = pcVar9 + -2;
  } while (lVar13 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != paVar1) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f0,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_3f0);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar4 = local_3d0->type;
    __val = -XVar4;
    if (0 < (int)XVar4) {
      __val = XVar4;
    }
    __len = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar15 = (ulong)__val;
      uVar7 = 4;
      do {
        __len = uVar7;
        uVar12 = (uint)uVar15;
        if (uVar12 < 100) {
          __len = __len - 2;
          goto LAB_0019ffea;
        }
        if (uVar12 < 1000) {
          __len = __len - 1;
          goto LAB_0019ffea;
        }
        if (uVar12 < 10000) goto LAB_0019ffea;
        uVar15 = uVar15 / 10000;
        uVar7 = __len + 4;
      } while (99999 < uVar12);
      __len = __len + 1;
    }
LAB_0019ffea:
    local_328._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_328,(char)__len - (char)((int)XVar4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_328._M_dataplus._M_p + (XVar4 >> 0x1f),__len,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_3f0,&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_2f8 = 0;
    uStack_2f0 = 0;
    local_308 = 0;
    uStack_300 = 0;
    local_328.field_2._M_allocated_capacity = 0;
    local_328.field_2._8_8_ = 0;
    local_328._M_dataplus._M_p = (pointer)0x0;
    local_328._M_string_length = 0;
    p_Var6 = gen_dispatch_table->StructureTypeToString;
    pXVar10 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var6)(pXVar10,local_3d0->type,(char *)&local_328);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_3f0,(char (*) [64])&local_328);
  }
  local_3a8 = local_398;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3a8,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_3a8);
  value_00 = local_3d0->next;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_348,local_3a8,local_3a0 + (long)local_3a8);
  bVar8 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_348,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if (bVar8) {
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    pcVar5 = (prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3c8,pcVar5,pcVar5 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_3c8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,"0x",2);
    *(uint *)((long)&local_328.field_2 + *(long *)(local_328._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_328.field_2 + *(long *)(local_328._M_dataplus._M_p + -0x18) + 8) &
         0xffffffb5 | 8;
    __s = local_3d0->textureColorMap;
    sVar11 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,(char *)__s,sVar11);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])0x2a6e29,&local_3c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    pXVar2 = (XrPassthroughColorMapMonoToMonoFB *)(local_1a8 + 0x10);
    if ((XrPassthroughColorMapMonoToMonoFB *)local_1a8._0_8_ != pXVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    uVar15 = 0;
    do {
      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_388,local_3c8._M_dataplus._M_p,
                 local_3c8._M_dataplus._M_p + local_3c8._M_string_length);
      std::__cxx11::string::append((char *)&local_388);
      cVar14 = '\x03' - (uVar15 < 100);
      if (uVar15 < 10) {
        cVar14 = '\x01';
      }
      local_1a8._0_8_ = pXVar2;
      std::__cxx11::string::_M_construct((ulong)local_1a8,cVar14);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_1a8._0_8_,local_1a8._8_4_,(uint)uVar15);
      std::__cxx11::string::_M_append((char *)&local_388,local_1a8._0_8_);
      if ((XrPassthroughColorMapMonoToMonoFB *)local_1a8._0_8_ != pXVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      std::__cxx11::string::append((char *)&local_388);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"0x",2);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 8;
      local_368._M_dataplus._M_p._0_1_ = __s[uVar15];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_368,1);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [8])"uint8_t",&local_388,&local_368);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_368._M_dataplus._M_p._1_7_,(uint8_t)local_368._M_dataplus._M_p) !=
          &local_368.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_368._M_dataplus._M_p._1_7_,
                                 (uint8_t)local_368._M_dataplus._M_p),
                        local_368.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != 0x100);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
    std::ios_base::~ios_base(local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if (local_3a8 != local_398) {
      operator_delete(local_3a8,local_398[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrPassthroughColorMapMonoToMonoFB* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string texturecolormap_prefix = prefix;
        texturecolormap_prefix += "textureColorMap";
        std::ostringstream oss_textureColorMap_array;
        oss_textureColorMap_array << "0x" << std::hex << (value->textureColorMap);
        contents.emplace_back("uint8_t*", texturecolormap_prefix, oss_textureColorMap_array.str());
        for (uint32_t value_texturecolormap_inc = 0; value_texturecolormap_inc < XR_PASSTHROUGH_COLOR_MAP_MONO_SIZE_FB; ++value_texturecolormap_inc) {
            std::string texturecolormap_array_prefix = texturecolormap_prefix;
            texturecolormap_array_prefix += "[";
            texturecolormap_array_prefix += std::to_string(value_texturecolormap_inc);
            texturecolormap_array_prefix += "]";
            std::ostringstream oss_textureColorMap;
            oss_textureColorMap << "0x" << std::hex << (value->textureColorMap[value_texturecolormap_inc]);
            contents.emplace_back("uint8_t", texturecolormap_array_prefix, oss_textureColorMap.str());
        }
        return true;
    } catch(...) {
    }
    return false;
}